

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

ostream * cts::operator<<(ostream *out,string *s)

{
  char *__s;
  size_t sVar1;
  
  __s = (s->m_str).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start;
  if (__s == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar1);
  }
  return out;
}

Assistant:

std::ostream& operator<< (std::ostream& out, string const& s)
{
	return out << s.c_str();
}